

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int binstrcaseless(const_bstring b1,int pos,const_bstring b2)

{
  int iVar1;
  uchar *puVar2;
  uchar *puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int local_4c;
  uchar *d1;
  uchar *d0;
  int ll;
  int l;
  int i;
  int j;
  const_bstring b2_local;
  int pos_local;
  const_bstring b1_local;
  
  if (((((b1 == (const_bstring)0x0) || (b1->data == (uchar *)0x0)) || (b1->slen < 0)) ||
      ((b2 == (const_bstring)0x0 || (b2->data == (uchar *)0x0)))) || (b2->slen < 0)) {
    b1_local._4_4_ = -1;
  }
  else if (b1->slen == pos) {
    local_4c = pos;
    if (b2->slen != 0) {
      local_4c = -1;
    }
    b1_local._4_4_ = local_4c;
  }
  else if ((b1->slen < pos) || (pos < 0)) {
    b1_local._4_4_ = -1;
  }
  else {
    b1_local._4_4_ = pos;
    if (b2->slen != 0) {
      iVar4 = (b1->slen - b2->slen) + 1;
      if (pos < iVar4) {
        if ((b1->data == b2->data) && (pos == 0)) {
          b1_local._4_4_ = 0;
        }
        else {
          l = 0;
          puVar2 = b2->data;
          puVar3 = b1->data;
          iVar1 = b2->slen;
          ll = pos;
LAB_0015f6a8:
          do {
            if (puVar2[l] != puVar3[ll + l]) {
              iVar5 = tolower((uint)puVar2[l]);
              iVar6 = tolower((uint)puVar3[ll + l]);
              if (iVar5 != iVar6) {
                ll = ll + 1;
                if (iVar4 <= ll) {
                  return -1;
                }
                l = 0;
                goto LAB_0015f6a8;
              }
            }
            l = l + 1;
          } while (l < iVar1);
          b1_local._4_4_ = ll;
        }
      }
      else {
        b1_local._4_4_ = -1;
      }
    }
  }
  return b1_local._4_4_;
}

Assistant:

int binstrcaseless (const_bstring b1, int pos, const_bstring b2) {
int j, i, l, ll;
unsigned char * d0, * d1;

	if (b1 == NULL || b1->data == NULL || b1->slen < 0 ||
	    b2 == NULL || b2->data == NULL || b2->slen < 0) return BSTR_ERR;
	if (b1->slen == pos) return (b2->slen == 0)?pos:BSTR_ERR;
	if (b1->slen < pos || pos < 0) return BSTR_ERR;
	if (b2->slen == 0) return pos;

	l = b1->slen - b2->slen + 1;

	/* No space to find such a string? */
	if (l <= pos) return BSTR_ERR;

	/* An obvious alias case */
	if (b1->data == b2->data && pos == 0) return BSTR_OK;

	i = pos;
	j = 0;

	d0 = b2->data;
	d1 = b1->data;
	ll = b2->slen;

	for (;;) {
		if (d0[j] == d1[i + j] || downcase (d0[j]) == downcase (d1[i + j])) {
			j ++;
			if (j >= ll) return i;
		} else {
			i ++;
			if (i >= l) break;
			j=0;
		}
	}

	return BSTR_ERR;
}